

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::ConvolveScale2DTest_DISABLED_Speed_Test::
~ConvolveScale2DTest_DISABLED_Speed_Test(ConvolveScale2DTest_DISABLED_Speed_Test *this)

{
  ConvolveScale2DTest_DISABLED_Speed_Test *in_stack_00000010;
  
  anon_unknown.dwarf_1933e1::ConvolveScale2DTest_DISABLED_Speed_Test::
  ~ConvolveScale2DTest_DISABLED_Speed_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(ConvolveScale2DTest, DISABLED_Speed) {
  const uint8_t *const in = input();
  uint8_t *const out = output();
  const InterpKernel *const filter =
      (const InterpKernel *)av1_get_interp_filter_kernel(EIGHTTAP_REGULAR,
                                                         USE_8_TAPS);
  const int kNumTests = 10000;
  const int width = Width();
  const int height = Height();
  const int frac = 8;
  const int step = 16;
  aom_usec_timer timer;

  aom_usec_timer_start(&timer);
  for (int n = 0; n < kNumTests; ++n) {
    test_func_(in, kInputStride, out, kOutputStride, filter, frac, step, frac,
               step, width, height);
  }
  aom_usec_timer_mark(&timer);

  const int elapsed_time = static_cast<int>(aom_usec_timer_elapsed(&timer));
  printf("convolve_scale_2d_%dx%d_%d: %d us\n", width, height, 8, elapsed_time);
}